

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void screen_wipe(tgestate_t *state,uint8_t *dst,uint8_t width,uint8_t height)

{
  uint8_t *slp;
  undefined7 in_register_00000011;
  uint8_t uVar1;
  
  slp = dst;
  uVar1 = height;
  do {
    memset(slp,0,CONCAT71(in_register_00000011,width) & 0xffffffff);
    slp = get_next_scanline(state,slp);
    uVar1 = uVar1 + 0xff;
  } while (uVar1 != '\0');
  invalidate_bitmap(state,dst,(uint)width << 3,(uint)height);
  return;
}

Assistant:

void screen_wipe(tgestate_t *state,
                 uint8_t    *dst,
                 uint8_t     width,
                 uint8_t     height)
{
  uint8_t  h;
  uint8_t *curr_dst;

  assert(state != NULL);
  assert(dst   != NULL);
  assert(width  > 0);
  assert(height > 0);

  h        = height;
  curr_dst = dst;
  do
  {
    memset(curr_dst, 0, width);
    curr_dst = get_next_scanline(state, curr_dst);
  }
  while (--h);

  /* Conv: Invalidation added over the original game. */
  invalidate_bitmap(state, dst, width * 8, height);
}